

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHDivProjection.cpp
# Opt level: O3

void __thiscall
TPZHDivProjection<double>::Contribute
          (TPZHDivProjection<double> *this,TPZMaterialDataT<double> *data,REAL weight,
          TPZFMatrix<double> *ek,TPZFMatrix<double> *ef)

{
  TPZFNMatrix<20,_double> *pTVar1;
  TPZFNMatrix<60,_double> *pTVar2;
  TPZFNMatrix<9,_double> *this_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int64_t iVar10;
  pair<int,_long> *ppVar11;
  char cVar12;
  ulong uVar13;
  int id;
  long lVar14;
  long lVar15;
  int i;
  long lVar16;
  ulong uVar17;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  TPZManVector<double,_4> solLoc;
  TPZFNMatrix<3,_double> ivec;
  TPZFNMatrix<3,_double> axesvec_1;
  TPZFNMatrix<3,_double> axesvec;
  TPZFNMatrix<3,_double> jvec;
  double local_3e0;
  double local_3c8;
  uint local_3b8;
  int local_388;
  TPZVec<double> local_330;
  double local_310 [4];
  TPZFMatrix<double> local_2f0;
  double local_260 [4];
  TPZFMatrix<double> local_240;
  double local_1b0 [4];
  TPZFMatrix<double> local_190;
  double local_100 [4];
  TPZFMatrix<double> local_e0;
  double local_50 [4];
  
  TPZVec<double>::TPZVec(&local_330,0);
  local_330._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0187b960;
  local_330.fStore = local_310;
  local_330.fNElements = 4;
  local_330.fNAlloc = 0;
  cVar12 = (**(code **)(*(long *)this + 0x60))(this);
  if (cVar12 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZHDivProjection<>::Contribute(const TPZMaterialDataT<TVar> &, REAL, TPZFMatrix<TVar> &, TPZFMatrix<TVar> &) [TVar = double]"
               ,0x8a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," a forcing function (solution to be projected)\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"has not been set! Aborting...\n",0x1e);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Material/Projection/TPZHDivProjection.cpp"
               ,0x1e);
  }
  if (*(long *)&this->field_0x28 == 0) {
    std::__throw_bad_function_call();
  }
  (**(code **)&this->field_0x30)(&this->field_0x18,&(data->super_TPZMaterialData).x,&local_330);
  iVar10 = (data->super_TPZMaterialData).fVecShapeIndex.super_TPZVec<std::pair<int,_long>_>.
           fNElements;
  local_2f0.fElem = local_260;
  local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018454a8;
  local_2f0.fSize = 3;
  local_2f0.fGiven = local_2f0.fElem;
  TPZVec<int>::TPZVec(&local_2f0.fPivot.super_TPZVec<int>,0);
  local_2f0.fPivot.super_TPZVec<int>.fStore = local_2f0.fPivot.fExtAlloc;
  local_2f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_2f0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_2f0.fWork.fStore = (double *)0x0;
  local_2f0.fWork.fNElements = 0;
  local_2f0.fWork.fNAlloc = 0;
  local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018451b8;
  TPZFMatrix<double>::operator=(&local_2f0,0.0);
  local_e0.fElem = local_50;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018454a8;
  local_e0.fSize = 3;
  local_e0.fGiven = local_e0.fElem;
  TPZVec<int>::TPZVec(&local_e0.fPivot.super_TPZVec<int>,0);
  local_e0.fPivot.super_TPZVec<int>.fStore = local_e0.fPivot.fExtAlloc;
  local_e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_e0.fWork.fStore = (double *)0x0;
  local_e0.fWork.fNElements = 0;
  local_e0.fWork.fNAlloc = 0;
  local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018451b8;
  TPZFMatrix<double>::operator=(&local_e0,0.0);
  local_3b8 = (uint)iVar10;
  if (0 < (int)local_3b8) {
    pTVar1 = &(data->super_TPZMaterialData).phi;
    pTVar2 = &(data->super_TPZMaterialData).dphix;
    this_00 = &(data->super_TPZMaterialData).axes;
    uVar13 = 0;
    do {
      ppVar11 = (data->super_TPZMaterialData).fVecShapeIndex.super_TPZVec<std::pair<int,_long>_>.
                fStore;
      iVar9 = ppVar11[uVar13].first;
      lVar15 = ppVar11[uVar13].second;
      lVar14 = 0;
      do {
        if ((local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar14) ||
           (local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_2f0.fElem[lVar14] =
             (data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.fElem
             [(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
              super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * (long)iVar9 + lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      local_3e0 = 0.0;
      lVar14 = 0;
      do {
        if ((local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar14) ||
           (local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_3e0 = local_3e0 + local_2f0.fElem[lVar14] * local_330.fStore[lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      lVar15 = (long)(int)lVar15;
      (*(pTVar1->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
        super_TPZSavable._vptr_TPZSavable[0x24])(pTVar1,lVar15,0);
      if (((ef->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)uVar13) ||
         ((ef->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      ef->fElem[uVar13] = local_3e0 * weight * extraout_XMM0_Qa + ef->fElem[uVar13];
      local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
      local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018454a8;
      local_190.fSize = 3;
      local_190.fElem = local_100;
      local_190.fGiven = local_100;
      TPZVec<int>::TPZVec(&local_190.fPivot.super_TPZVec<int>,0);
      local_190.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_190.fPivot.super_TPZVec<int>.fStore = local_190.fPivot.fExtAlloc;
      local_190.fPivot.super_TPZVec<int>.fNElements = 0;
      local_190.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_190.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_190.fWork.fStore = (double *)0x0;
      local_190.fWork.fNElements = 0;
      local_190.fWork.fNAlloc = 0;
      local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_018451b8;
      TPZFMatrix<double>::operator=(&local_190,0.0);
      TPZMatrix<double>::Multiply((TPZMatrix<double> *)this_00,&local_2f0,&local_190,0);
      if (this->fDim < 1) {
        local_3c8 = 0.0;
      }
      else {
        local_3c8 = 0.0;
        lVar14 = 0;
        do {
          if ((local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar14) ||
             (local_190.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dVar3 = local_190.fElem[lVar14];
          (*(pTVar2->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable[0x24])(pTVar2,lVar14,lVar15);
          local_3c8 = local_3c8 + dVar3 * extraout_XMM0_Qa_00;
          lVar14 = lVar14 + 1;
        } while (lVar14 < this->fDim);
      }
      uVar17 = 0;
      do {
        ppVar11 = (data->super_TPZMaterialData).fVecShapeIndex.super_TPZVec<std::pair<int,_long>_>.
                  fStore;
        iVar9 = ppVar11[uVar17].first;
        lVar14 = ppVar11[uVar17].second;
        lVar16 = 0;
        do {
          if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
             (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_e0.fElem[lVar16] =
               (data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.fElem
               [(data->super_TPZMaterialData).fDeformedDirections.super_TPZFMatrix<double>.
                super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * (long)iVar9 + lVar16];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
        if ((local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
           (local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar3 = *local_2f0.fElem;
        if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
           (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar4 = *local_e0.fElem;
        if ((local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
           (local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar5 = local_2f0.fElem[1];
        if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
           (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar6 = local_e0.fElem[1];
        if ((local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) ||
           (local_2f0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar7 = local_2f0.fElem[2];
        if ((local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 3) ||
           (local_e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar8 = local_e0.fElem[2];
        (*(pTVar1->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
          super_TPZSavable._vptr_TPZSavable[0x24])(pTVar1,lVar15,0);
        local_388 = (int)lVar14;
        (*(pTVar1->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
          super_TPZSavable._vptr_TPZSavable[0x24])(pTVar1,(long)local_388,0);
        lVar14 = (ek->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar14 <= (long)uVar13) ||
           ((ek->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar17)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar14 = lVar14 * uVar17;
        ek->fElem[lVar14 + uVar13] =
             extraout_XMM0_Qa_01 * weight * extraout_XMM0_Qa_02 *
             (dVar7 * dVar8 + dVar3 * dVar4 + dVar5 * dVar6) + ek->fElem[lVar14 + uVar13];
        local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
        local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
        local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFMatrix_018454a8;
        local_240.fSize = 3;
        local_240.fElem = local_1b0;
        local_240.fGiven = local_1b0;
        TPZVec<int>::TPZVec(&local_240.fPivot.super_TPZVec<int>,0);
        local_240.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
        local_240.fPivot.super_TPZVec<int>.fStore = local_240.fPivot.fExtAlloc;
        local_240.fPivot.super_TPZVec<int>.fNElements = 0;
        local_240.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_240.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        local_240.fWork.fStore = (double *)0x0;
        local_240.fWork.fNElements = 0;
        local_240.fWork.fNAlloc = 0;
        local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFNMatrix_018451b8;
        TPZFMatrix<double>::operator=(&local_240,0.0);
        TPZMatrix<double>::Multiply((TPZMatrix<double> *)this_00,&local_e0,&local_240,0);
        if (this->fDim < 1) {
          local_3e0 = 0.0;
        }
        else {
          local_3e0 = 0.0;
          lVar14 = 0;
          do {
            if ((local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar14) ||
               (local_240.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dVar3 = local_240.fElem[lVar14];
            (*(pTVar2->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
              super_TPZSavable._vptr_TPZSavable[0x24])(pTVar2,lVar14,(long)local_388);
            local_3e0 = local_3e0 + dVar3 * extraout_XMM0_Qa_03;
            lVar14 = lVar14 + 1;
          } while (lVar14 < this->fDim);
        }
        lVar14 = (ek->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar14 <= (long)uVar13) ||
           ((ek->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar17)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar14 = lVar14 * uVar17;
        ek->fElem[lVar14 + uVar13] = local_3e0 * local_3c8 * weight + ek->fElem[lVar14 + uVar13];
        TPZFMatrix<double>::~TPZFMatrix(&local_240,&PTR_PTR_01845470);
        uVar17 = uVar17 + 1;
      } while (uVar17 != (local_3b8 & 0x7fffffff));
      TPZFMatrix<double>::~TPZFMatrix(&local_190,&PTR_PTR_01845470);
      uVar13 = uVar13 + 1;
    } while (uVar13 != (local_3b8 & 0x7fffffff));
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_e0,&PTR_PTR_01845470);
  TPZFMatrix<double>::~TPZFMatrix(&local_2f0,&PTR_PTR_01845470);
  if (local_330.fStore != local_310) {
    local_330.fNAlloc = 0;
    local_330._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_330.fStore != (double *)0x0) {
      operator_delete__(local_330.fStore);
    }
  }
  return;
}

Assistant:

void TPZHDivProjection<TVar>::Contribute(const TPZMaterialDataT<TVar> &data,
                                       REAL weight,
                                       TPZFMatrix<TVar> &ek, TPZFMatrix<TVar> &ef){
	
	const int nshape = data.phi.Rows();
    //last position of solLoc is the divergence
    TPZManVector<TVar,4> solLoc(4);
    if(!this->HasForcingFunction()){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" a forcing function (solution to be projected)\n";
        PZError<<"has not been set! Aborting...\n";
        DebugStop();
    }
    this->fForcingFunction(data.x,solLoc);
    const TVar divSol = solLoc[3];

    /*
     * HDiv approximation spaces in NeoPZ are created 
     * from the combination of scalar functions with 
     * constant vector fields
     */
    
    // Setting the scalar phis
    const TPZFMatrix<REAL> &phiQ = data.phi;
    const TPZFMatrix<REAL> &dphiQ = data.dphix;
    
    const int phrq = data.fVecShapeIndex.NElements();
    
    //Calculate the matrix contribution for flux. Matrix A
    TPZFNMatrix<3,REAL> ivec(3,1,0.);
    TPZFNMatrix<3,REAL> jvec(3,1,0.);
    for(int iq=0; iq<phrq; iq++)
    {
        //ef(iq, 0) += 0.;
        const int ivecind = data.fVecShapeIndex[iq].first;
        const int ishapeind = data.fVecShapeIndex[iq].second;
        
        for(int id=0; id<3; id++){
            ivec(id,0) = data.fDeformedDirections.GetVal(id,ivecind);
        }
        TVar ff = 0.;
        
        for (int i=0; i<3; i++) {
            ff += ivec(i,0)*solLoc[i];
        }
        
        ef(iq,0) += weight*ff*phiQ.GetVal(ishapeind,0);
        REAL divqi = 0.;
        TPZFNMatrix<3,REAL> axesvec(3,1,0.);
        data.axes.Multiply(ivec,axesvec);
        //computin div(qj)
        for(int iloc=0; iloc<fDim; iloc++){
            divqi += axesvec(iloc,0)*dphiQ.GetVal(iloc,ishapeind);
        }
        for (int jq=0; jq<phrq; jq++)
        {
            int jvecind = data.fVecShapeIndex[jq].first;
            int jshapeind = data.fVecShapeIndex[jq].second;
            
            for(int id=0; id<3; id++){
                jvec(id,0) = data.fDeformedDirections.GetVal(id,jvecind);
            }
            
            //jvecZ.Print("mat1 = ");
            const REAL prod1 = ivec(0,0)*jvec(0,0) + ivec(1,0)*jvec(1,0) + ivec(2,0)*jvec(2,0);
            ek(iq,jq) +=
                    weight*phiQ.GetVal(ishapeind,0)*phiQ.GetVal(jshapeind,0)*prod1;

            REAL divqj = 0.;
            TPZFNMatrix<3,REAL> axesvec(3,1,0.);
            data.axes.Multiply(jvec,axesvec);
            //computin div(qj)
            for(int jloc=0; jloc<fDim; jloc++){
                divqj += axesvec(jloc,0)*dphiQ.GetVal(jloc,jshapeind);
            }
            ek(iq,jq) += weight*divqi*divqj;
        }
    }
}